

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O2

int_t mc64ad_(int_t *job,int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int_t *num,int *cperm,
             int_t *liw,int_t *iw,int_t *ldw,double *dw,int_t *icntl,int_t *info)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int_t iVar11;
  int_t *piVar12;
  int_t *piVar13;
  int iVar14;
  uint uVar15;
  int_t *ne_00;
  char *pcVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  undefined8 uVar23;
  double local_68;
  
  dVar21 = dmach("Overflow");
  uVar15 = *job;
  if (uVar15 - 6 < 0xfffffffb) {
    *info = -1;
    piVar12 = (int_t *)(ulong)(uint)*job;
    info[1] = *job;
    if (*icntl < 0) {
      return 0;
    }
    pcVar16 = " ****** Error in MC64A/AD. INFO(1) = %2d because JOB = %d\n";
    uVar23 = 0xffffffffffffffff;
    goto LAB_00110e44;
  }
  uVar2 = *n;
  if ((int)uVar2 < 1) {
    *info = -2;
    info[1] = *n;
    if (*icntl < 0) {
      return 0;
    }
    piVar12 = (int_t *)(ulong)(uint)*job;
    pcVar16 = " ****** Error in MC64A/AD. INFO(1) = %2d because N = %d\n";
    uVar23 = 0xfffffffffffffffe;
    goto LAB_00110e44;
  }
  uVar3 = *ne;
  ne_00 = (int_t *)(ulong)uVar3;
  if ((int)uVar3 < 1) {
    *info = -3;
    info[1] = *ne;
    if (*icntl < 0) {
      return 0;
    }
    piVar12 = (int_t *)(ulong)(uint)*job;
    pcVar16 = " ****** Error in MC64A/AD. INFO(1) = %2d because NE = %d\n";
    uVar23 = 0xfffffffffffffffd;
    goto LAB_00110e44;
  }
  uVar9 = uVar2 * 5;
  switch(uVar15) {
  case 2:
    uVar9 = uVar2 * 4;
    bVar4 = false;
    bVar5 = false;
    uVar10 = uVar2;
    break;
  case 3:
    uVar9 = uVar2 * 10 + uVar3;
    bVar4 = true;
    bVar5 = false;
    uVar10 = uVar9;
    break;
  case 4:
    bVar5 = true;
    bVar4 = false;
    uVar10 = uVar9;
    break;
  case 5:
    if (*liw < (int)uVar9) goto LAB_00110ede;
    piVar12 = (int_t *)(ulong)(uVar3 + uVar2 * 3);
    ne_00 = piVar12;
    goto LAB_00110ea1;
  default:
    if (*liw < (int)uVar9) goto LAB_00110ede;
    goto LAB_00110f0a;
  }
  if (*liw < (int)uVar9) {
LAB_00110ede:
    *info = -4;
    info[1] = uVar9;
    if (*icntl < 0) {
      return 0;
    }
    pcVar16 = " ****** Error in MC64A/AD. INFO(1) = %2d LIW too small, must be at least %8d\n";
    uVar23 = 0xfffffffffffffffc;
    piVar12 = (int_t *)(ulong)uVar9;
LAB_00110e44:
    printf(pcVar16,uVar23,piVar12);
    return 0;
  }
  if (1 < uVar15) {
    if (bVar4) {
      uVar10 = uVar3;
    }
    piVar12 = (int_t *)(ulong)uVar10;
    if (bVar5) {
      piVar12 = (int_t *)(ulong)(uVar3 + uVar2 * 2);
    }
LAB_00110ea1:
    if (*ldw < (int)piVar12) {
      *info = -5;
      info[1] = (int)piVar12;
      if (*icntl < 0) {
        return 0;
      }
      pcVar16 = " ****** Error in MC64A/AD. INFO(1) = %2d LDW too small, must be at least %8d\n";
      uVar23 = 0xfffffffffffffffb;
      goto LAB_00110e44;
    }
  }
LAB_00110f0a:
  if (icntl[3] == 0) {
    for (uVar19 = 0; uVar2 != uVar19; uVar19 = uVar19 + 1) {
      iw[uVar19] = 0;
    }
    iVar14 = 0;
    if (0 < *n) {
      iVar14 = *n;
    }
    piVar12 = (int_t *)0x1;
    while (piVar13 = piVar12, piVar13 != (int_t *)(ulong)(iVar14 + 1)) {
      ne_00 = (int_t *)((long)piVar13 + 1);
      iVar17 = ip[(long)piVar13];
      for (lVar6 = (long)ip[(long)piVar13 - 1]; piVar12 = ne_00, lVar6 < iVar17; lVar6 = lVar6 + 1)
      {
        lVar7 = (long)irn[lVar6 + -1];
        iVar11 = (int_t)piVar13;
        if ((lVar7 < 1) || (*n < irn[lVar6 + -1])) {
          *info = -6;
          info[1] = iVar11;
          if (*icntl < 0) {
            return 0;
          }
          pcVar16 = 
          " ****** Error in MC64A/AD. INFO(1) = %2d Column %8d contains an entry with invalid row index %8d\n"
          ;
          uVar23 = 0xfffffffffffffffa;
LAB_0011116a:
          printf(pcVar16,uVar23);
          return 0;
        }
        if (piVar13 == (int_t *)(ulong)(uint)iw[lVar7 + -1]) {
          *info = -7;
          info[1] = iVar11;
          if (*icntl < 0) {
            return 0;
          }
          pcVar16 = 
          " ****** Error in MC64A/AD. INFO(1) = %2d        Column %8d contains two or more entries with row index %8d\n"
          ;
          uVar23 = 0xfffffffffffffff9;
          goto LAB_0011116a;
        }
        iw[lVar7 + -1] = iVar11;
      }
    }
  }
  if (-1 < icntl[2]) {
    ne_00 = (int_t *)(ulong)(uint)*job;
    printf("  ****** Input parameters for MC64A/AD: JOB = %8d, N = %d, NE = %8d\n",ne_00,
           (ulong)(uint)*n,(ulong)(uint)*ne);
    printf(" IP(1:N+1)   = ");
    for (uVar19 = 1; (long)uVar19 <= (long)*n + 1; uVar19 = uVar19 + 1) {
      ne_00 = (int_t *)(ulong)(uint)ip[uVar19 - 1];
      printf("%8d");
      if ((uVar19 & 7) == 0) {
        putchar(10);
      }
    }
    printf("\n IRN(1:NE) = ");
    for (uVar19 = 1; (long)uVar19 <= (long)*ne; uVar19 = uVar19 + 1) {
      ne_00 = (int_t *)(ulong)(uint)irn[uVar19 - 1];
      printf("%8d");
      if ((uVar19 & 7) == 0) {
        putchar(10);
      }
    }
    putchar(10);
    if (1 < *job) {
      printf(" A(1:NE)     = ");
      for (uVar19 = 1; (long)uVar19 <= (long)*ne; uVar19 = uVar19 + 1) {
        printf("%f14.4",a[uVar19 - 1]);
        if ((uVar19 & 3) == 0) {
          putchar(10);
        }
      }
      putchar(10);
    }
  }
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    info[lVar6] = 0;
  }
  switch(*job) {
  case 1:
    uVar8 = 0;
    uVar19 = (ulong)(uint)*n;
    if (*n < 1) {
      uVar19 = uVar8;
    }
    for (; uVar19 != uVar8; uVar8 = uVar8 + 1) {
      iw[uVar8] = ip[uVar8 + 1] - ip[uVar8];
    }
    puts(" ****** Warning from MC64A/AD. Need to link mc21ad.");
    break;
  case 2:
    iVar14 = *n;
    mc64bd_(n,iw + iVar14,ip,irn,a,cperm,num,iw,iw + iVar14,iw + (long)(iVar14 * 2 + 1) + -1,
            iw + (long)iVar14 * 3,dw);
    break;
  case 3:
    uVar8 = 0;
    uVar19 = (ulong)(uint)*ne;
    if (*ne < 1) {
      uVar19 = uVar8;
    }
    for (; uVar19 != uVar8; uVar8 = uVar8 + 1) {
      iw[uVar8] = irn[uVar8];
      dVar21 = a[uVar8];
      uVar20 = -(ulong)(-dVar21 <= dVar21);
      dw[uVar8] = (double)(~uVar20 & (ulong)-dVar21 | (ulong)dVar21 & uVar20);
    }
    mc64rd_(n,ne_00,ip,iw,dw);
    iVar14 = *ne;
    iVar17 = *n;
    mc64sd_(n,ne,ip,iw,dw,cperm,num,iw + iVar14,iw + (iVar17 + iVar14),iw + (iVar14 + iVar17 * 2),
            iw + (iVar17 * 3 + iVar14),iw + (iVar14 + iVar17 * 4),iw + (iVar17 * 5 + iVar14),
            iw + (iVar17 * 6 + iVar14));
    break;
  case 4:
    iVar14 = *n;
    iVar17 = 0;
    if (0 < iVar14) {
      iVar17 = iVar14;
    }
    uVar19 = 1;
    while (uVar19 != iVar17 + 1) {
      uVar8 = uVar19 + 1;
      iVar18 = ip[uVar19];
      dVar21 = 0.0;
      lVar7 = (long)ip[uVar19 - 1];
      for (lVar6 = lVar7; lVar6 < iVar18; lVar6 = lVar6 + 1) {
        dVar22 = a[lVar6 + -1];
        uVar19 = -(ulong)(-dVar22 <= dVar22);
        dVar22 = (double)(~uVar19 & (ulong)-dVar22 | (ulong)dVar22 & uVar19);
        if (dVar22 <= dVar21) {
          dVar22 = dVar21;
        }
        dVar21 = dVar22;
      }
      for (; uVar19 = uVar8, lVar7 < iVar18; lVar7 = lVar7 + 1) {
        dVar22 = a[lVar7 + -1];
        uVar19 = -(ulong)(-dVar22 <= dVar22);
        dw[(long)(iVar14 * 2) + lVar7 + -1] =
             dVar21 - (double)(~uVar19 & (ulong)-dVar22 | (ulong)dVar22 & uVar19);
      }
    }
    lVar6 = (long)(int)(iVar14 * 2 | 1);
    mc64wd_(n,iw + iVar14,ip,irn,dw + lVar6 + -1,cperm,num,iw,iw + iVar14,iw + lVar6 + -1,
            iw + iVar14 * 3,iw + (long)(iVar14 * 4 + 1) + -1,dw,dw + iVar14);
    break;
  case 5:
    iVar14 = 0;
    if (0 < *n) {
      iVar14 = *n;
    }
    uVar19 = 1;
    while (uVar19 != iVar14 + 1) {
      uVar8 = uVar19 + 1;
      iVar17 = ip[uVar19 - 1];
      iVar11 = ip[uVar19];
      dVar22 = 0.0;
      for (lVar6 = (long)iVar17; lVar6 < iVar11; lVar6 = lVar6 + 1) {
        dVar1 = a[lVar6 + -1];
        uVar20 = -(ulong)(-dVar1 <= dVar1);
        dVar1 = (double)(~uVar20 & (ulong)-dVar1 | (ulong)dVar1 & uVar20);
        dw[(long)*n * 3 + lVar6 + -1] = dVar1;
        if (dVar1 <= dVar22) {
          dVar1 = dVar22;
        }
        dVar22 = dVar1;
      }
      iVar18 = *n;
      dw[(long)((int)uVar19 + iVar18 * 2) + -1] = dVar22;
      if ((dVar22 != 0.0) || (NAN(dVar22))) {
        local_68 = log(dVar22);
        iVar17 = ip[uVar19 - 1];
        iVar11 = ip[uVar19];
      }
      else {
        local_68 = dVar21 / (double)iVar18;
      }
      for (lVar6 = (long)iVar17; uVar19 = uVar8, (int)lVar6 < iVar11; lVar6 = lVar6 + 1) {
        lVar7 = (long)*n * 3 + lVar6;
        dVar22 = dw[lVar7 + -1];
        if ((dVar22 != 0.0) || (NAN(dVar22))) {
          dVar22 = log(dVar22);
          dVar22 = local_68 - dVar22;
          lVar7 = (long)*n * 3 + lVar6;
        }
        else {
          dVar22 = dVar21 / (double)*n;
        }
        dw[lVar7 + -1] = dVar22;
      }
    }
    iVar14 = *n;
    lVar6 = (long)iVar14;
    mc64wd_(n,iw + lVar6,ip,irn,dw + lVar6 * 3,cperm,num,iw,iw + lVar6,
            iw + (long)(iVar14 * 2 + 1) + -1,iw + lVar6 * 3,iw + (long)(iVar14 * 4 + 1) + -1,dw,
            dw + lVar6);
    iVar14 = *num;
    iVar17 = 1;
    if (iVar14 == *n) {
      iVar18 = 0;
      if (0 < iVar14) {
        iVar18 = iVar14;
      }
      for (; iVar17 - iVar18 != 1; iVar17 = iVar17 + 1) {
        dVar22 = dw[(long)(iVar17 + iVar14 * 2) + -1];
        if ((dVar22 != 0.0) || (NAN(dVar22))) {
          dVar22 = log(dVar22);
          iVar14 = *n;
          dw[(long)(iVar17 + iVar14) + -1] = dw[(long)(iVar17 + iVar14) + -1] - dVar22;
        }
        else {
          dw[(long)(iVar14 + iVar17) + -1] = 0.0;
        }
      }
    }
    dVar21 = log(dVar21);
    dVar21 = dVar21 * 0.5;
    uVar15 = *n;
    uVar19 = 0;
    uVar8 = 0;
    if (0 < (int)uVar15) {
      uVar8 = (ulong)uVar15;
    }
    do {
      if (uVar8 == uVar19) goto switchD_00111119_default;
    } while ((dw[uVar19] <= dVar21 && dVar21 != dw[uVar19]) &&
            (lVar6 = (long)(int)uVar15 + uVar19, uVar19 = uVar19 + 1,
            dw[lVar6] <= dVar21 && dVar21 != dw[lVar6]));
    *info = 2;
    goto LAB_001116c0;
  }
switchD_00111119_default:
  iVar14 = *info;
  if (iVar14 == 0) {
    if ((*n <= *num) || (*info = 1, icntl[1] < 0)) goto LAB_00111717;
    printf(" ****** Warning from MC64A/AD. INFO(1) = %2d The matrix is structurally singular.\n",1);
    iVar14 = *info;
  }
  if (iVar14 == 2) {
LAB_001116c0:
    if (-1 < icntl[1]) {
      printf(" ****** Warning from MC64A/AD. INFO(1) = %2d\n        Some scaling factors may be too large.\n"
             ,2);
    }
  }
LAB_00111717:
  if (-1 < icntl[2]) {
    printf(" ****** Output parameters for MC64A/AD: INFO(1:2)  = %8d%8d\n",(ulong)(uint)*info,
           (ulong)(uint)info[1]);
    printf(" NUM        = %8d",(ulong)(uint)*num);
    printf(" CPERM(1:N) = ");
    for (uVar19 = 1; (long)uVar19 <= (long)*n; uVar19 = uVar19 + 1) {
      printf("%8d",(ulong)(uint)cperm[uVar19 - 1]);
      if ((uVar19 & 7) == 0) {
        putchar(10);
      }
    }
    if (*job == 5) {
      printf("\n DW(1:N)    = ");
      iVar14 = -1;
      for (uVar19 = 1; (long)uVar19 <= (long)*n; uVar19 = uVar19 + 1) {
        printf("%11.3f",dw[uVar19 - 1]);
        if ((int)((uVar19 & 0xffffffff) / 5) * 5 + iVar14 == 0) {
          putchar(10);
        }
        iVar14 = iVar14 + -1;
      }
      printf("\n DW(N+1:2N) = ");
      uVar15 = 1;
      iVar14 = -1;
      while( true ) {
        if (*n < (int)uVar15) break;
        printf("%11.3f",dw[(long)(int)(*n + uVar15) + -1]);
        if ((uVar15 / 5) * 5 + iVar14 == 0) {
          putchar(10);
        }
        uVar15 = uVar15 + 1;
        iVar14 = iVar14 + -1;
      }
      putchar(10);
    }
  }
  return 0;
}

Assistant:

int_t mc64ad_(int_t *job, int_t *n, int_t *ne, int_t *
	ip, int_t *irn, double *a, int_t *num, int *cperm, 
	int_t *liw, int_t *iw, int_t *ldw, double *dw, int_t *
	icntl, int_t *info)
{
    /* System generated locals */
    int_t i__1, i__2;
    double d__1, d__2;

    /* Builtin functions */
    double log(double);

    /* Local variables */
    int_t i__, j, k;
    double fact, rinf;

    extern /* Subroutine */ int_t mc21ad_(int_t *, int_t *, int_t *, 
	    int_t *, int_t *, int_t *, int_t *, int_t *),
	mc64bd_(int_t *n, int_t *ne, int_t *ip, int_t *irn, double *a,
		int *iperm, int_t *num, int_t *jperm, 
		int_t *pr, int_t *q, int_t *l, double *d__),
	mc64rd_(int_t *n, int_t *ne, int_t *ip, int_t *irn, double *a),
	mc64sd_(int_t *n, int_t *ne, int_t *ip, int_t *irn, double *a,
		int *iperm, int_t *numx, int_t *w, int_t *len, int_t *lenl,
		int_t *lenh, int_t *fc, int_t *iw, int_t *iw4),
	mc64wd_(int_t *n, int_t *ne, int_t *ip, int_t *irn, double *a,
		int *iperm, int_t *num, int_t *jperm, int_t *out,
		int_t *pr, int_t *q, int_t *l, double *u, double *d__);

/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/*  Purpose */
/*  ======= */

/* This subroutine attempts to find a column permutation for an NxN */
/* sparse matrix A = {a_ij} that makes the permuted matrix have N */
/* entries on its diagonal. */
/* If the matrix is structurally nonsingular, the subroutine optionally */
/* returns a column permutation that maximizes the smallest element */
/* on the diagonal, maximizes the sum of the diagonal entries, or */
/* maximizes the product of the diagonal entries of the permuted matrix. */
/* For the latter option, the subroutine also finds scaling factors */
/* that may be used to scale the matrix so that the nonzero diagonal */
/* entries of the permuted matrix are one in absolute value and all the */
/* off-diagonal entries are less than or equal to one in absolute value. */
/* The natural logarithms of the scaling factors u(i), i=1..N, for the */
/* rows and v(j), j=1..N, for the columns are returned so that the */
/* scaled matrix B = {b_ij} has entries b_ij = a_ij * EXP(u_i + v_j). */

/*  Parameters */
/*  ========== */


/* JOB is an INT_T variable which must be set by the user to */
/* control the action. It is not altered by the subroutine. */
/* Possible values for JOB are: */
/*   1 Compute a column permutation of the matrix so that the */
/*     permuted matrix has as many entries on its diagonal as possible. */
/*     The values on the diagonal are of arbitrary size. HSL subroutine */
/*     MC21A/AD is used for this. See [1]. */
/*   2 Compute a column permutation of the matrix so that the smallest */
/*     value on the diagonal of the permuted matrix is maximized. */
/*     See [3]. */
/*   3 Compute a column permutation of the matrix so that the smallest */
/*     value on the diagonal of the permuted matrix is maximized. */
/*     The algorithm differs from the one used for JOB = 2 and may */
/*     have quite a different performance. See [2]. */
/*   4 Compute a column permutation of the matrix so that the sum */
/*     of the diagonal entries of the permuted matrix is maximized. */
/*     See [3]. */
/*   5 Compute a column permutation of the matrix so that the product */
/*     of the diagonal entries of the permuted matrix is maximized */
/*     and vectors to scale the matrix so that the nonzero diagonal */
/*     entries of the permuted matrix are one in absolute value and */
/*     all the off-diagonal entries are less than or equal to one in */
/*     absolute value. See [3]. */
/*  Restriction: 1 <= JOB <= 5. */

/* N is an INT_T variable which must be set by the user to the */
/*   order of the matrix A. It is not altered by the subroutine. */
/*   Restriction: N >= 1. */

/* NE is an INT_T variable which must be set by the user to the */
/*   number of entries in the matrix. It is not altered by the */
/*   subroutine. */
/*   Restriction: NE >= 1. */

/* IP is an INT_T array of length N+1. */
/*   IP(J), J=1..N, must be set by the user to the position in array IRN */
/*   of the first row index of an entry in column J. IP(N+1) must be set */
/*   to NE+1. It is not altered by the subroutine. */

/* IRN is an INT_T array of length NE. */
/*   IRN(K), K=1..NE, must be set by the user to hold the row indices of */
/*   the entries of the matrix. Those belonging to column J must be */
/*   stored contiguously in the positions IP(J)..IP(J+1)-1. The ordering */
/*   of the row indices within each column is unimportant. Repeated */
/*   entries are not allowed. The array IRN is not altered by the */
/*   subroutine. */

/* A is a REAL (DOUBLE PRECISION in the D-version) array of length NE. */
/*   The user must set A(K), K=1..NE, to the numerical value of the */
/*   entry that corresponds to IRN(K). */
/*   It is not used by the subroutine when JOB = 1. */
/*   It is not altered by the subroutine. */

/* NUM is an INT_T variable that need not be set by the user. */
/*   On successful exit, NUM will be the number of entries on the */
/*   diagonal of the permuted matrix. */
/*   If NUM < N, the matrix is structurally singular. */

/* CPERM is an INT_T array of length N that need not be set by the */
/*   user. On successful exit, CPERM contains the column permutation. */
/*   Column CPERM(J) of the original matrix is column J in the permuted */
/*   matrix, J=1..N. */

/* LIW is an INT_T variable that must be set by the user to */
/*   the dimension of array IW. It is not altered by the subroutine. */
/*   Restriction: */
/*     JOB = 1 :  LIW >= 5N */
/*     JOB = 2 :  LIW >= 4N */
/*     JOB = 3 :  LIW >= 10N + NE */
/*     JOB = 4 :  LIW >= 5N */
/*     JOB = 5 :  LIW >= 5N */

/* IW is an INT_T array of length LIW that is used for workspace. */

/* LDW is an INT_T variable that must be set by the user to the */
/*   dimension of array DW. It is not altered by the subroutine. */
/*   Restriction: */
/*     JOB = 1 :  LDW is not used */
/*     JOB = 2 :  LDW >= N */
/*     JOB = 3 :  LDW >= NE */
/*     JOB = 4 :  LDW >= 2N + NE */
/*     JOB = 5 :  LDW >= 3N + NE */

/* DW is a REAL (DOUBLE PRECISION in the D-version) array of length LDW */
/*   that is used for workspace. If JOB = 5, on return, */
/*   DW(i) contains u_i, i=1..N, and DW(N+j) contains v_j, j=1..N. */

/* ICNTL is an INT_T array of length 10. Its components control the */
/*   output of MC64A/AD and must be set by the user before calling */
/*   MC64A/AD. They are not altered by the subroutine. */

/*   ICNTL(1) must be set to specify the output stream for */
/*   error messages. If ICNTL(1) < 0, messages are suppressed. */
/*   The default value set by MC46I/ID is 6. */

/*   ICNTL(2) must be set by the user to specify the output stream for */
/*   warning messages. If ICNTL(2) < 0, messages are suppressed. */
/*   The default value set by MC46I/ID is 6. */

/*   ICNTL(3) must be set by the user to specify the output stream for */
/*   diagnostic messages. If ICNTL(3) < 0, messages are suppressed. */
/*   The default value set by MC46I/ID is -1. */

/*   ICNTL(4) must be set by the user to a value other than 0 to avoid */
/*   checking of the input data. */
/*   The default value set by MC46I/ID is 0. */

/* INFO is an INT_T array of length 10 which need not be set by the */
/*   user. INFO(1) is set non-negative to indicate success. A negative */
/*   value is returned if an error occurred, a positive value if a */
/*   warning occurred. INFO(2) holds further information on the error. */
/*   On exit from the subroutine, INFO(1) will take one of the */
/*   following values: */
/*    0 : successful entry (for structurally nonsingular matrix). */
/*   +1 : successful entry (for structurally singular matrix). */
/*   +2 : the returned scaling factors are large and may cause */
/*        overflow when used to scale the matrix. */
/*        (For JOB = 5 entry only.) */
/*   -1 : JOB < 1 or JOB > 5.  Value of JOB held in INFO(2). */
/*   -2 : N < 1.  Value of N held in INFO(2). */
/*   -3 : NE < 1. Value of NE held in INFO(2). */
/*   -4 : the defined length LIW violates the restriction on LIW. */
/*        Value of LIW required given by INFO(2). */
/*   -5 : the defined length LDW violates the restriction on LDW. */
/*        Value of LDW required given by INFO(2). */
/*   -6 : entries are found whose row indices are out of range. INFO(2) */
/*        contains the index of a column in which such an entry is found. */
/*   -7 : repeated entries are found. INFO(2) contains the index of a */
/*        column in which such entries are found. */
/*  INFO(3) to INFO(10) are not currently used and are set to zero by */
/*        the routine. */

/* References: */
/*  [1]  I. S. Duff, (1981), */
/*       "Algorithm 575. Permutations for a zero-free diagonal", */
/*       ACM Trans. Math. Software 7(3), 387-390. */
/*  [2]  I. S. Duff and J. Koster, (1998), */
/*       "The design and use of algorithms for permuting large */
/*       entries to the diagonal of sparse matrices", */
/*       SIAM J. Matrix Anal. Appl., vol. 20, no. 4, pp. 889-901. */
/*  [3]  I. S. Duff and J. Koster, (1999), */
/*       "On algorithms for permuting large entries to the diagonal */
/*       of sparse matrices", */
/*       Technical Report RAL-TR-1999-030, RAL, Oxfordshire, England. */
/* Local variables and parameters */
/* External routines and functions */
/*     EXTERNAL FD05AD */
/*     DOUBLE PRECISION FD05AD */
/* Intrinsic functions */
/* Set RINF to largest positive real number (infinity) */
/* XSL    RINF = FD05AD(5) */
    /* Parameter adjustments */
    --cperm;
    --ip;
    --a;
    --irn;
    --iw;
    --dw;
    --icntl;
    --info;

    /* Function Body */
    rinf = dmach("Overflow");
/* Check value of JOB */
    if (*job < 1 || *job > 5) {
	info[1] = -1;
	info[2] = *job;
	if (icntl[1] >= 0) {
	    printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
		   " because JOB = %d\n", (int) info[1], (int) *job);
	}
	goto L99;
    }
/* Check value of N */
    if (*n < 1) {
	info[1] = -2;
	info[2] = *n;
	if (icntl[1] >= 0) {
	    printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
		   " because N = %d\n", (int) info[1], (int) *job);
	}
	goto L99;
    }
/* Check value of NE */
    if (*ne < 1) {
	info[1] = -3;
	info[2] = *ne;
	if (icntl[1] >= 0) {
	    printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
		   " because NE = %d\n", (int) info[1], (int) *job);
	}
	goto L99;
    }
/* Check LIW */
    if (*job == 1) {
	k = *n * 5;
    }
    if (*job == 2) {
	k = *n << 2;
    }
    if (*job == 3) {
	k = *n * 10 + *ne;
    }
    if (*job == 4) {
	k = *n * 5;
    }
    if (*job == 5) {
	k = *n * 5;
    }
    if (*liw < k) {
	info[1] = -4;
	info[2] = k;
	if (icntl[1] >= 0) {
	    printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
		   " LIW too small, must be at least %8d\n", (int) info[1], (int) k);
	}
	goto L99;
    }
/* Check LDW */
/* If JOB = 1, do not check */
    if (*job > 1) {
	if (*job == 2) {
	    k = *n;
	}
	if (*job == 3) {
	    k = *ne;
	}
	if (*job == 4) {
	    k = (*n << 1) + *ne;
	}
	if (*job == 5) {
	    k = *n * 3 + *ne;
	}
	if (*ldw < k) {
	    info[1] = -5;
	    info[2] = k;
	    if (icntl[1] >= 0) {
		printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
		       " LDW too small, must be at least %8d\n", (int) info[1], (int) k);
	    }
	    goto L99;
	}
    }
    if (icntl[4] == 0) {
/* Check row indices. Use IW(1:N) as workspace */
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    iw[i__] = 0;
/* L3: */
	}
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		i__ = irn[k];
/* Check for row indices that are out of range */
		if (i__ < 1 || i__ > *n) {
		    info[1] = -6;
		    info[2] = j;
		    if (icntl[1] >= 0) {
			printf(" ****** Error in MC64A/AD. INFO(1) = %2d Column %8d"
			       " contains an entry with invalid row index %8d\n",
			       (int) info[1], (int) j, (int) i__);
		    }
		    goto L99;
		}
/* Check for repeated row indices within a column */
		if (iw[i__] == j) {
		    info[1] = -7;
		    info[2] = j;
		    if (icntl[1] >= 0) {
			printf(" ****** Error in MC64A/AD. INFO(1) = %2d"
			       "        Column %8d"
			       " contains two or more entries with row index %8d\n",
			       (int) info[1], (int) j, (int) i__);
		    }
		    goto L99;
		} else {
		    iw[i__] = j;
		}
/* L4: */
	    }
/* L6: */
	    }
    }
/* Print diagnostics on input */
    if (icntl[3] >= 0) {
	printf("  ****** Input parameters for MC64A/AD: JOB = %8d,"
	       " N = %d, NE = %8d\n", (int) *job, (int) *n, (int) *ne);
	printf(" IP(1:N+1)   = ");
	for (j=1; j<=(*n+1); ++j) {
	    printf("%8d", (int) ip[j]);
	    if (j%8 == 0) printf("\n");
	}
	printf("\n IRN(1:NE) = ");
	for (j=1; j<=(*ne); ++j) {
	    printf("%8d", (int) irn[j]);
	    if (j%8 == 0) printf("\n");
	}
	printf("\n");

	if (*job > 1) {
	    printf(" A(1:NE)     = ");
	    for (j=1; j<=(*ne); ++j) {
		printf("%f14.4", a[j]);
		if (j%4 == 0) printf("\n");
	    }
	    printf("\n");
	}
    }
/* Set components of INFO to zero */
    for (i__ = 1; i__ <= 10; ++i__) {
	info[i__] = 0;
/* L8: */
    }
/* Compute maximum matching with MC21A/AD */
    if (*job == 1) {
/* Put length of column J in IW(J) */
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    iw[j] = ip[j + 1] - ip[j];
/* L10: */
	}
/* IW(N+1:5N) is workspace */
#if 0
	mc21ad_(n, &irn[1], ne, &ip[1], &iw[1], &cperm[1], num, &iw[*n+1]);
#else
	printf(" ****** Warning from MC64A/AD. Need to link mc21ad.\n");
#endif
	goto L90;
    }
/* Compute bottleneck matching */
    if (*job == 2) {
/* IW(1:5N), DW(1:N) are workspaces */
	mc64bd_(n, ne, &ip[1], &irn[1], &a[1], &cperm[1], num, &iw[1], &iw[*n 
		+ 1], &iw[(*n << 1) + 1], &iw[*n * 3 + 1], &dw[1]);
	goto L90;
    }
/* Compute bottleneck matching */
    if (*job == 3) {
/* Copy IRN(K) into IW(K), ABS(A(K)) into DW(K), K=1..NE */
	i__1 = *ne;
	for (k = 1; k <= i__1; ++k) {
	    iw[k] = irn[k];
	    dw[k] = (d__1 = a[k], abs(d__1));
/* L20: */
	}
/* Sort entries in each column by decreasing value. */
	mc64rd_(n, ne, &ip[1], &iw[1], &dw[1]);
/* IW(NE+1:NE+10N) is workspace */
	mc64sd_(n, ne, &ip[1], &iw[1], &dw[1], &cperm[1], num, &iw[*ne + 1], &
		iw[*ne + *n + 1], &iw[*ne + (*n << 1) + 1], &iw[*ne + *n * 3 
		+ 1], &iw[*ne + (*n << 2) + 1], &iw[*ne + *n * 5 + 1], &iw[*
		ne + *n * 6 + 1]);
	goto L90;
    }
    if (*job == 4) {
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    fact = 0.;
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		if ((d__1 = a[k], abs(d__1)) > fact) {
		    fact = (d__2 = a[k], abs(d__2));
		}
/* L30: */
	    }
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		dw[(*n << 1) + k] = fact - (d__1 = a[k], abs(d__1));
/* L40: */
	    }
/* L50: */
	}
/* B = DW(2N+1:2N+NE); IW(1:5N) and DW(1:2N) are workspaces */
	mc64wd_(n, ne, &ip[1], &irn[1], &dw[(*n << 1) + 1], &cperm[1], num, &
		iw[1], &iw[*n + 1], &iw[(*n << 1) + 1], &iw[*n * 3 + 1], &iw[(
		*n << 2) + 1], &dw[1], &dw[*n + 1]);
	goto L90;
    }
    if (*job == 5) {
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    fact = 0.;
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		dw[*n * 3 + k] = (d__1 = a[k], abs(d__1));
		if (dw[*n * 3 + k] > fact) {
		    fact = dw[*n * 3 + k];
		}
/* L60: */
	    }
	    dw[(*n << 1) + j] = fact;
	    if (fact != 0.) {
		fact = log(fact);
	    } else {
		fact = rinf / *n;
	    }
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		if (dw[*n * 3 + k] != 0.) {
		    dw[*n * 3 + k] = fact - log(dw[*n * 3 + k]);
		} else {
		    dw[*n * 3 + k] = rinf / *n;
		}
/* L70: */
	    }
/* L75: */
	}
/* B = DW(3N+1:3N+NE); IW(1:5N) and DW(1:2N) are workspaces */
	mc64wd_(n, ne, &ip[1], &irn[1], &dw[*n * 3 + 1], &cperm[1], num, &iw[
		1], &iw[*n + 1], &iw[(*n << 1) + 1], &iw[*n * 3 + 1], &iw[(*n 
		<< 2) + 1], &dw[1], &dw[*n + 1]);
	if (*num == *n) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (dw[(*n << 1) + j] != 0.) {
		    dw[*n + j] -= log(dw[(*n << 1) + j]);
		} else {
		    dw[*n + j] = 0.;
		}
/* L80: */
	    }
	}
/* Check size of scaling factors */
	fact = log(rinf) * .5f;
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    if (dw[j] < fact && dw[*n + j] < fact) {
		goto L86;
	    }
	    info[1] = 2;
	    goto L90;
L86:
	    ;
	}
/*       GO TO 90 */
    }
L90:
    if (info[1] == 0 && *num < *n) {
/* Matrix is structurally singular, return with warning */
	info[1] = 1;
	if (icntl[2] >= 0) {
	    printf(" ****** Warning from MC64A/AD. INFO(1) = %2d"
		   " The matrix is structurally singular.\n", (int)info[1]);
	}
    }
    if (info[1] == 2) {
/* Scaling factors are large, return with warning */
	if (icntl[2] >= 0) {
	    printf(" ****** Warning from MC64A/AD. INFO(1) = %2d\n"
		   "        Some scaling factors may be too large.\n", (int) info[1]);
	}
    }
/* Print diagnostics on output */
    if (icntl[3] >= 0) {
	printf(" ****** Output parameters for MC64A/AD: INFO(1:2)  = %8d%8d\n",
	       (int) info[1], (int) info[2]);
	printf(" NUM        = %8d", (int) *num);
	printf(" CPERM(1:N) = ");
	for (j=1; j<=*n; ++j) {
	    printf("%8d", (int) cperm[j]);
	    if (j%8 == 0) printf("\n");
	}
	if (*job == 5) {
	    printf("\n DW(1:N)    = ");
	    for (j=1; j<=*n; ++j) {
		printf("%11.3f", dw[j]);
		if (j%5 == 0) printf("\n");
	    }
	    printf("\n DW(N+1:2N) = ");
	    for (j=1; j<=*n; ++j) {
		printf("%11.3f", dw[*n+j]);
		if (j%5 == 0) printf("\n");
	    }
	    printf("\n");
	}
    }
/* Return from subroutine. */
L99:
    return 0;
}